

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementCableANCF.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementCableANCF::ComputeInternalForces_Impl
          (ChElementCableANCF *this,ChVector<double> *pA,ChVector<double> *dA,ChVector<double> *pB,
          ChVector<double> *dB,ChVector<double> *pA_dt,ChVector<double> *dA_dt,
          ChVector<double> *pB_dt,ChVector<double> *dB_dt,ChVectorDynamic<> *Fi)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  element_type *peVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [16];
  undefined1 auVar12 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  ChVectorN<double,_12> Fcurv;
  ChVectorN<double,_12> Faxial;
  ChVectorN<double,_12> vel_vector;
  ChMatrixNM<double,_4,_3> d;
  CableANCF_ForceAxial myformulaAx;
  CableANCF_ForceCurv myformulaCurv;
  double local_910;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>
  local_908;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>_>
  local_8e0 [24];
  double local_8c8;
  RhsNested local_8c0;
  ChVectorN<double,_12> *local_8b0;
  DenseBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_> local_8a0 [96];
  DenseBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_> local_840 [96];
  undefined1 local_7e0 [64];
  undefined1 local_7a0 [32];
  undefined1 local_780 [64];
  undefined1 local_740 [32];
  ChIntegrable1D<Eigen::Matrix<double,_12,_1,_0,_12,_1>_> local_720;
  ChElementCableANCF *local_718;
  undefined1 *local_710;
  undefined1 *local_708;
  ChIntegrable1D<Eigen::Matrix<double,_12,_1,_0,_12,_1>_> local_540;
  ChElementCableANCF *local_538;
  undefined1 *local_530;
  undefined1 *local_528;
  undefined1 auVar13 [64];
  
  if ((Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows != 0xc)
  {
    __assert_fail("Fi.size() == 12",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChElementCableANCF.cpp"
                  ,0x1bc,
                  "void chrono::fea::ChElementCableANCF::ComputeInternalForces_Impl(const ChVector<> &, const ChVector<> &, const ChVector<> &, const ChVector<> &, const ChVector<> &, const ChVector<> &, const ChVector<> &, const ChVector<> &, ChVectorDynamic<> &)"
                 );
  }
  peVar9 = (this->section).
           super___shared_ptr<chrono::fea::ChBeamSectionCable,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar9 != (element_type *)0x0) {
    dVar1 = *(double *)(peVar9 + 0x28);
    auVar16._8_8_ = 0;
    auVar16._0_8_ = dVar1;
    auVar11._8_8_ = 0x8000000000000000;
    auVar11._0_8_ = 0x8000000000000000;
    auVar11 = vxorpd_avx512vl(auVar16,auVar11);
    dVar2 = *(double *)(peVar9 + 0x20);
    dVar3 = *(double *)(peVar9 + 0x18);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = pA->m_data[2];
    vbroadcastsd_avx512f(auVar5);
    auVar12 = vpermt2pd_avx512f(_DAT_00eac980,ZEXT1664(*(undefined1 (*) [16])dA->m_data));
    auVar6._8_8_ = 0;
    auVar6._0_8_ = dA->m_data[2];
    auVar13 = vbroadcastsd_avx512f(auVar6);
    auVar14._0_40_ = auVar12._0_40_;
    auVar14._40_8_ = auVar13._40_8_;
    auVar14._48_8_ = auVar12._48_8_;
    auVar14._56_8_ = auVar12._56_8_;
    local_780 = vinsertf32x4_avx512f(auVar14,*(undefined1 (*) [16])pB->m_data,3);
    auVar10 = vpermpd_avx2(ZEXT1632(*(undefined1 (*) [16])dB->m_data),0xd0);
    auVar10 = vblendps_avx(auVar10,ZEXT832((ulong)pB->m_data[2]),3);
    dVar4 = dB->m_data[2];
    auVar17._8_8_ = dVar4;
    auVar17._0_8_ = dVar4;
    auVar17._16_8_ = dVar4;
    auVar17._24_8_ = dVar4;
    local_740 = vblendps_avx(auVar10,auVar17,0xc0);
    auVar7._8_8_ = 0;
    auVar7._0_8_ = pA_dt->m_data[2];
    vbroadcastsd_avx512f(auVar7);
    auVar12 = vpermt2pd_avx512f(_DAT_00eac980,ZEXT1664(*(undefined1 (*) [16])dA_dt->m_data));
    auVar8._8_8_ = 0;
    auVar8._0_8_ = dA_dt->m_data[2];
    auVar13 = vbroadcastsd_avx512f(auVar8);
    auVar15._0_40_ = auVar12._0_40_;
    auVar15._40_8_ = auVar13._40_8_;
    auVar15._48_8_ = auVar12._48_8_;
    auVar15._56_8_ = auVar12._56_8_;
    local_7e0 = vinsertf32x4_avx512f(auVar15,*(undefined1 (*) [16])pB_dt->m_data,3);
    auVar10 = vpermpd_avx2(ZEXT1632(*(undefined1 (*) [16])dB_dt->m_data),0xd0);
    auVar10 = vblendps_avx(auVar10,ZEXT832((ulong)pB_dt->m_data[2]),3);
    dVar4 = dB_dt->m_data[2];
    auVar18._8_8_ = dVar4;
    auVar18._0_8_ = dVar4;
    auVar18._16_8_ = dVar4;
    auVar18._24_8_ = dVar4;
    local_720._vptr_ChIntegrable1D = (_func_int **)&PTR__ChIntegrable1D_0117f740;
    local_7a0 = vblendps_avx(auVar10,auVar18,0xc0);
    local_718 = this;
    local_710 = local_780;
    local_708 = local_7e0;
    Eigen::DenseBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>::setZero(local_840);
    ChQuadrature::Integrate1D<Eigen::Matrix<double,12,1,0,12,1>>
              ((Matrix<double,_12,_1,_0,_12,_1> *)local_840,&local_720,0.0,1.0,5);
    local_540._vptr_ChIntegrable1D =
         (_func_int **)(auVar11._0_8_ * dVar3 * (this->super_ChElementBeam).length);
    Eigen::DenseBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>::operator*=
              (local_840,(Scalar *)&local_540);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,12,1,0,12,1>>
              (Fi,(Matrix<double,_12,_1,_0,_12,_1> *)local_840);
    local_540._vptr_ChIntegrable1D = (_func_int **)&PTR__ChIntegrable1D_0117f780;
    local_538 = this;
    local_530 = local_780;
    local_528 = local_7e0;
    Eigen::DenseBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>::setZero(local_8a0);
    ChQuadrature::Integrate1D<Eigen::Matrix<double,12,1,0,12,1>>
              ((Matrix<double,_12,_1,_0,_12,_1> *)local_8a0,&local_540,0.0,1.0,3);
    local_910 = dVar1 * dVar2 * (this->super_ChElementBeam).length;
    Eigen::operator*(&local_908,&local_910,(StorageBaseType *)local_8a0);
    local_8b0 = &this->m_GenForceVec0;
    local_8c8 = local_908.m_lhs.m_functor.m_other;
    local_8c0 = local_908.m_rhs;
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-=
              ((MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)Fi,local_8e0);
    return;
  }
  __assert_fail("section",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChElementCableANCF.cpp"
                ,0x1bd,
                "void chrono::fea::ChElementCableANCF::ComputeInternalForces_Impl(const ChVector<> &, const ChVector<> &, const ChVector<> &, const ChVector<> &, const ChVector<> &, const ChVector<> &, const ChVector<> &, const ChVector<> &, ChVectorDynamic<> &)"
               );
}

Assistant:

void ChElementCableANCF::ComputeInternalForces_Impl(const ChVector<>& pA,
                                                    const ChVector<>& dA,
                                                    const ChVector<>& pB,
                                                    const ChVector<>& dB,
                                                    const ChVector<>& pA_dt,
                                                    const ChVector<>& dA_dt,
                                                    const ChVector<>& pB_dt,
                                                    const ChVector<>& dB_dt,
                                                    ChVectorDynamic<>& Fi) {
    assert(Fi.size() == 12);
    assert(section);

    double Area = section->Area;
    double E = section->E;
    double I = section->I;

    // this matrix will be used in both CableANCF_ForceAxial and CableANCF_ForceCurv integrators
    ChMatrixNM<double, 4, 3> d;
    d(0, 0) = pA.x();
    d(0, 1) = pA.y();
    d(0, 2) = pA.z();
    d(1, 0) = dA.x();
    d(1, 1) = dA.y();
    d(1, 2) = dA.z();
    d(2, 0) = pB.x();
    d(2, 1) = pB.y();
    d(2, 2) = pB.z();
    d(3, 0) = dB.x();
    d(3, 1) = dB.y();
    d(3, 2) = dB.z();

    // this matrix will be used in both CableANCF_ForceAxial and CableANCF_ForceCurv integrators
    ChVectorN<double, 12> vel_vector;
    vel_vector(0) = pA_dt.x();
    vel_vector(1) = pA_dt.y();
    vel_vector(2) = pA_dt.z();
    vel_vector(3) = dA_dt.x();
    vel_vector(4) = dA_dt.y();
    vel_vector(5) = dA_dt.z();
    vel_vector(6) = pB_dt.x();
    vel_vector(7) = pB_dt.y();
    vel_vector(8) = pB_dt.z();
    vel_vector(9) = dB_dt.x();
    vel_vector(10) = dB_dt.y();
    vel_vector(11) = dB_dt.z();

    // 1)
    // Integrate   (strainD'*strain)

    class CableANCF_ForceAxial : public ChIntegrable1D<ChVectorN<double, 12>> {
      public:
        ChElementCableANCF* element;
        ChMatrixNM<double, 4, 3>* d;  // this is an external matrix, use pointer
        ChVectorN<double, 12>* d_dt;  // this is an external matrix, use pointer
        ChMatrixNM<double, 3, 12> Sd;
        ChElementCableANCF::ShapeVector Nd;
        ChMatrixNM<double, 1, 12> strainD;
        ChMatrixNM<double, 1, 3> Nd_d;

        // Evaluate (strainD'*strain)  at point x
        virtual void Evaluate(ChVectorN<double, 12>& result, const double x) override {
            element->ShapeFunctionsDerivatives(Nd, x);

            // Sd=[Nd1*eye(3) Nd2*eye(3) Nd3*eye(3) Nd4*eye(3)]
            Sd.setZero();
            for (int i = 0; i < 4; i++) {
                Sd(0, 3 * i + 0) = Nd(i);
                Sd(1, 3 * i + 1) = Nd(i);
                Sd(2, 3 * i + 2) = Nd(i);
            }

            Nd_d = Nd * (*d);
            strainD = Nd_d * Sd;

            // strain = (Nd*(d*d')*Nd'-1)*0.5;
            double strain = 0.5 * (Nd_d.dot(Nd_d) - 1);

            // Add damping forces if selected
            if (element->m_use_damping)
                strain += (element->m_alpha) * (strainD * (*d_dt))(0, 0);

            result = strainD.transpose() * strain;
        }
    };

    CableANCF_ForceAxial myformulaAx;
    myformulaAx.d = &d;
    myformulaAx.d_dt = &vel_vector;
    myformulaAx.element = this;

    ChVectorN<double, 12> Faxial;
    Faxial.setZero();
    ChQuadrature::Integrate1D<ChVectorN<double, 12>>(Faxial,       // result of integration will go there
                                                     myformulaAx,  // formula to integrate
                                                     0,            // start of x
                                                     1,            // end of x
                                                     5             // order of integration
    );
    Faxial *= -E * Area * length;

    Fi = Faxial;

    // 2)
    // Integrate   (k_e'*k_e)

    class CableANCF_ForceCurv : public ChIntegrable1D<ChVectorN<double, 12>> {
      public:
        ChElementCableANCF* element;
        ChMatrixNM<double, 4, 3>* d;  // this is an external matrix, use pointer
        ChVectorN<double, 12>* d_dt;  // this is an external matrix, use pointer
        ChMatrixNM<double, 3, 12> Sd;
        ChMatrixNM<double, 3, 12> Sdd;
        ChElementCableANCF::ShapeVector Nd;
        ChElementCableANCF::ShapeVector Ndd;
        ChMatrixNM<double, 1, 12> g_e;
        ChMatrixNM<double, 1, 12> f_e;
        ChMatrixNM<double, 1, 12> k_e;
        ChMatrixNM<double, 3, 12> fe1;

        // Evaluate  at point x
        virtual void Evaluate(ChVectorN<double, 12>& result, const double x) override {
            element->ShapeFunctionsDerivatives(Nd, x);
            element->ShapeFunctionsDerivatives2(Ndd, x);

            // Sd=[Nd1*eye(3) Nd2*eye(3) Nd3*eye(3) Nd4*eye(3)]
            // Sdd=[Ndd1*eye(3) Ndd2*eye(3) Ndd3*eye(3) Ndd4*eye(3)]
            Sd.setZero();
            for (int i = 0; i < 4; i++) {
                Sd(0, 3 * i + 0) = Nd(i);
                Sd(1, 3 * i + 1) = Nd(i);
                Sd(2, 3 * i + 2) = Nd(i);
            }

            Sdd.setZero();
            for (int i = 0; i < 4; i++) {
                Sdd(0, 3 * i + 0) = Ndd(i);
                Sdd(1, 3 * i + 1) = Ndd(i);
                Sdd(2, 3 * i + 2) = Ndd(i);
            }

            ChVector<> vr_x((*d).transpose() * Nd.transpose());
            ChVector<> vr_xx((*d).transpose() * Ndd.transpose());
            ChVector<> vf1 = Vcross(vr_x, vr_xx);
            double f = vf1.Length();
            double g1 = vr_x.Length();
            double g = pow(g1, 3);
            double k = f / g;

            g_e = (3 * g1) * Nd * (*d) * Sd;

            // do:  fe1=cross(Sd,r_xxrep)+cross(r_xrep,Sdd);
            for (int col = 0; col < 12; ++col) {
                ChVector<> Sd_i = Sd.col(col);
                fe1.col(col) = Vcross(Sd_i, vr_xx).eigen();
                ChVector<> Sdd_i = Sdd.col(col);
                fe1.col(col) += Vcross(vr_x, Sdd_i).eigen();
            }
            ChVectorN<double, 3> f1 = vf1.eigen();

            if (f == 0)
                f_e = f1.transpose() * fe1;
            else {
                f_e = (1 / f) * f1.transpose() * fe1;
            }

            k_e = (f_e * g - g_e * f) * (1 / (pow(g, 2)));

            // Add damping if selected by user: curvature rate
            if (element->m_use_damping)
                k += (element->m_alpha) * (k_e * (*d_dt))(0, 0);

            result = k * k_e.transpose();
        }
    };

    CableANCF_ForceCurv myformulaCurv;
    myformulaCurv.d = &d;
    myformulaCurv.d_dt = &vel_vector;
    myformulaCurv.element = this;

    ChVectorN<double, 12> Fcurv;
    Fcurv.setZero();
    ChQuadrature::Integrate1D<ChVectorN<double, 12>>(Fcurv,          // result of integration will go there
                                                     myformulaCurv,  // formula to integrate
                                                     0,              // start of x
                                                     1,              // end of x
                                                     3               // order of integration
    );

    // Also subtract contribution of initial configuration
    Fi -= (E * I * length) * Fcurv + m_GenForceVec0;
}